

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O0

KeyValue<supermap::Key<2UL>,_unsigned_long> __thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_void>
::get(SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_void>
      *this,unsigned_long index)

{
  KeyValue<supermap::Key<2UL>,_unsigned_long> KVar1;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_void>
  *this_00;
  format fVar2;
  string_type *in_stack_ffffffffffffff68;
  path *in_stack_ffffffffffffff70;
  FileManager *in_stack_ffffffffffffff78;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_void>
  local_40;
  path *local_10;
  unsigned_long local_8;
  
  this_00 = &local_40;
  getFileManager(this_00);
  std::__shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1e8220);
  fVar2 = (format)((ulong)&stack0xffffffffffffff78 >> 0x38);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,unsigned_long,void>
  ::getStorageFilePath_abi_cxx11_(this_00);
  std::filesystem::__cxx11::path::path(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,fVar2);
  io::FileManager::
  getInputIterator<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,unsigned_long>
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,(uint64_t)in_stack_ffffffffffffff68
            );
  KVar1 = io::
          InputIterator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_10UL,_void>
          ::next((InputIterator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_10UL,_void>
                  *)0x1e8284);
  local_8 = KVar1.value;
  KVar1._0_8_ = KVar1._0_8_;
  local_10 = KVar1._0_8_;
  io::
  InputIterator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_10UL,_void>::
  ~InputIterator((InputIterator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_10UL,_void>
                  *)0x1e82b5);
  std::filesystem::__cxx11::path::~path(KVar1._0_8_);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  std::shared_ptr<supermap::io::FileManager>::~shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)0x1e82d6);
  KVar1.value = local_8;
  KVar1._0_8_ = local_10;
  return KVar1;
}

Assistant:

[[nodiscard]] T get(IndexT index) const override {
        assert(index < getItemsCount());
        return getFileManager()->template getInputIterator<T, IndexT>(
            getStorageFilePath(),
            index * io::FixedDeserializedSizeRegister<T>::exactDeserializedSize
        ).next();
    }